

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O0

void __thiscall directory::shrink(directory *this)

{
  uint32_t uVar1;
  _Ios_Openmode _Var2;
  uint32_t uVar3;
  directory *__nbytes;
  void *__buf;
  int local_288;
  int j;
  bucket bucket;
  string local_248 [32];
  undefined1 local_228 [8];
  fstream bucketFile;
  uint local_14;
  int i;
  directory *this_local;
  
  local_14 = 0;
  while( true ) {
    if (this->bucket_size <= local_14) {
      this->depth = this->depth - 1;
      for (local_288 = 0; local_288 < 1 << ((byte)this->depth & 0x1f); local_288 = local_288 + 1) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back(&this->bucket_ids);
      }
      this->bucket_size = this->bucket_size >> 1;
      return;
    }
    __nbytes = this;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              (&this->bucket_ids,(long)(int)local_14);
    generateBucketFileName(local_248,(int)this + 8);
    _Var2 = std::operator|(_S_in,_S_out);
    _Var2 = std::operator|(_Var2,_S_bin);
    std::fstream::fstream(local_228,(string *)local_248,_Var2);
    std::__cxx11::string::~string((string *)local_248);
    ::bucket::bucket((bucket *)&j);
    ::bucket::read((bucket *)&j,(int)local_228,__buf,(size_t)__nbytes);
    uVar3 = ::bucket::getDepth((bucket *)&j);
    uVar1 = this->depth;
    ::bucket::~bucket((bucket *)&j);
    std::fstream::~fstream(local_228);
    if (uVar3 == uVar1) break;
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void directory::shrink() {
    for (int i = 0; i < bucket_size; ++i) {
        fstream bucketFile(generateBucketFileName(typeName, bucket_ids[i]), INOUTBIN);

        bucket bucket;

        bucket.read(bucketFile);

        if(bucket.getDepth() == depth) {
            return;
        }
    }

    depth--;

    for (int j = 0; j < 1 << depth; ++j) {
        bucket_ids.pop_back();
    }

    bucket_size = bucket_size >> 1;
}